

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O1

int __thiscall NetOptimize::replace_reduction_with_global_pooling(NetOptimize *this)

{
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **ppvVar1;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar2;
  Layer *pLVar3;
  Layer *pLVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  Layer *pLVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ParamDict pd;
  ParamDict local_40;
  
  pvVar2 = (this->super_ModelWriter).layers;
  lVar11 = (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_start;
  if (lVar11 != 0) {
    ppvVar1 = &(this->super_ModelWriter).layers;
    uVar12 = lVar11 >> 3;
    lVar11 = 0;
    do {
      iVar6 = std::__cxx11::string::compare
                        ((char *)&((*ppvVar1)->
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[lVar11]->type);
      if ((((iVar6 == 0) &&
           (pLVar3 = ((*ppvVar1)->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                     ._M_impl.super__Vector_impl_data._M_start[lVar11],
           *(int *)&pLVar3[1]._vptr_Layer == 3)) &&
          (*(int *)((long)&pLVar3[1]._vptr_Layer + 4) == 0)) &&
         (((*(float *)&pLVar3[1].one_blob_only == 1.0 && (!NAN(*(float *)&pLVar3[1].one_blob_only)))
          && ((*(int *)((long)&pLVar3[1].type._M_string_length + 4) == 1 &&
              ((**(uint **)&pLVar3[1].support_tensor_storage & 0xfffffffe) == 2)))))) {
        uVar9 = lVar11 + 1;
        uVar10 = uVar9;
        if (uVar9 < uVar12) {
          iVar6 = *(pLVar3->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            iVar7 = std::__cxx11::string::compare
                              ((char *)&((*ppvVar1)->
                                        super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                        )._M_impl.super__Vector_impl_data._M_start[uVar9]->type);
            if (((iVar7 == 0) &&
                (pLVar4 = ((*ppvVar1)->
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                          .super__Vector_impl_data._M_start[uVar9],
                piVar5 = (pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                (long)(pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar5 == 4)) &&
               (uVar10 = uVar9, *piVar5 == iVar6)) break;
            uVar9 = uVar9 + 1;
            uVar10 = uVar12;
          } while (uVar9 < uVar12);
        }
        if (((((uVar10 != uVar12) &&
              (pLVar4 = ((*ppvVar1)->
                        super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar10],
              *(int *)&pLVar4[1]._vptr_Layer == 3)) &&
             (*(int *)((long)&pLVar4[1]._vptr_Layer + 4) == 0)) &&
            ((*(float *)&pLVar4[1].one_blob_only == 1.0 &&
             (!NAN(*(float *)&pLVar4[1].one_blob_only))))) &&
           ((*(int *)((long)&pLVar4[1].type._M_string_length + 4) == 1 &&
            (**(int **)&pLVar4[1].support_tensor_storage == 2)))) {
          fprintf(_stderr,"replace_reduction_with_global_pooling %s %s\n",
                  (pLVar3->name)._M_dataplus._M_p,(pLVar4->name)._M_dataplus._M_p);
          pLVar8 = ncnn::create_layer("Pooling");
          std::__cxx11::string::operator=((string *)&pLVar8->type,"Pooling");
          std::__cxx11::string::_M_assign((string *)&pLVar8->name);
          std::vector<int,_std::allocator<int>_>::operator=(&pLVar8->bottoms,&pLVar4->bottoms);
          std::vector<int,_std::allocator<int>_>::operator=(&pLVar8->tops,&pLVar4->tops);
          ncnn::ParamDict::ParamDict(&local_40);
          (*pLVar8->_vptr_Layer[2])(pLVar8,&local_40);
          replace_reduction_with_global_pooling();
          iVar6 = *(pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          *(pLVar8->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start = iVar6;
          (((this->super_ModelWriter).blobs)->
          super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
          super__Vector_impl_data._M_start[iVar6].consumer = (int)uVar10;
          std::__cxx11::string::operator=((string *)&pLVar3->type,"ncnnfused");
          ncnn::ParamDict::~ParamDict(&local_40);
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != uVar12 + (uVar12 == 0));
  }
  return 0;
}

Assistant:

int NetOptimize::replace_reduction_with_global_pooling()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Reduction")
            continue;

        ncnn::Reduction* reduction1 = (ncnn::Reduction*)layers[i];
        if (reduction1->operation != 3 || reduction1->reduce_all != 0 || reduction1->coeff != 1.f)
            continue;

        if (reduction1->axes.w != 1)
            continue;

        const int* axes_ptr = reduction1->axes;
        if (axes_ptr[0] != 2 && axes_ptr[0] != 3)
            continue;

        // Reduction(2/3) - Reduction(2)
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "Reduction")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        ncnn::Reduction* reduction2 = (ncnn::Reduction*)layers[j];
        if (reduction2->operation != 3 || reduction2->reduce_all != 0 || reduction2->coeff != 1.f)
            continue;

        if (reduction2->axes.w != 1)
            continue;

        const int* axes2_ptr = reduction2->axes;
        if (axes2_ptr[0] != 2)
            continue;

        fprintf(stderr, "replace_reduction_with_global_pooling %s %s\n", reduction1->name.c_str(), reduction2->name.c_str());

        ncnn::Pooling* pooling = (ncnn::Pooling*)ncnn::create_layer("Pooling");

        pooling->type = "Pooling";
        pooling->name = reduction2->name;
        pooling->bottoms = reduction2->bottoms;
        pooling->tops = reduction2->tops;

        ncnn::ParamDict pd;
        pooling->load_param(pd);

        pooling->pooling_type = 1;
        pooling->global_pooling = 1;

        layers[j] = pooling;
        delete reduction2;

        int bottom_blob_index_final = reduction1->bottoms[0];
        pooling->bottoms[0] = bottom_blob_index_final;
        blobs[bottom_blob_index_final].consumer = j;
        reduction1->type = "ncnnfused";
    }

    return 0;
}